

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O0

int mk_iov_consume(mk_iov *mk_io,size_t bytes)

{
  ulong uVar1;
  size_t len;
  size_t sStack_20;
  int i;
  size_t bytes_local;
  mk_iov *mk_io_local;
  
  if (mk_io->total_len == bytes) {
    mk_io->total_len = 0;
    mk_io->iov_idx = 0;
  }
  else {
    sStack_20 = bytes;
    for (len._4_4_ = 0; len._4_4_ < mk_io->iov_idx; len._4_4_ = len._4_4_ + 1) {
      uVar1 = mk_io->io[len._4_4_].iov_len;
      if (uVar1 != 0) {
        if (sStack_20 < uVar1) {
          mk_io->io[len._4_4_].iov_base = (void *)((long)mk_io->io[len._4_4_].iov_base + sStack_20);
          mk_io->io[len._4_4_].iov_len = uVar1 - sStack_20;
          break;
        }
        if (sStack_20 == uVar1) {
          mk_io->io[len._4_4_].iov_len = 0;
          break;
        }
        mk_io->io[len._4_4_].iov_len = 0;
        sStack_20 = sStack_20 - uVar1;
      }
    }
    mk_io->total_len = mk_io->total_len - sStack_20;
  }
  return 0;
}

Assistant:

int mk_iov_consume(struct mk_iov *mk_io, size_t bytes)
{
    int i;
    size_t len;

    if (mk_io->total_len == bytes) {
        mk_io->total_len = 0;
        mk_io->iov_idx   = 0;
        return 0;
    }

    for (i = 0; i < mk_io->iov_idx; i++) {
        len = mk_io->io[i].iov_len;
        if (len == 0) {
            continue;
        }

        if (bytes < len) {
            mk_io->io[i].iov_base = (uint8_t *)mk_io->io[i].iov_base + bytes;
            mk_io->io[i].iov_len   = (len - bytes);
            break;
        }
        else if (bytes == len) {
            /* this entry was consumed */
            mk_io->io[i].iov_len = 0;
            break;
        }
        else {
            /* bytes > 0, consume this entry */
            mk_io->io[i].iov_len = 0;
            bytes -= len;
        }
    }

    mk_io->total_len -= (unsigned long)bytes;
    return 0;
}